

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

int Sim_UtilCountPairsOne(Extra_BitMat_t *pMat,Vec_Int_t *vSupport)

{
  int iVar1;
  int iVar2;
  undefined4 local_2c;
  undefined4 local_28;
  int Counter;
  int Index2;
  int Index1;
  int k;
  int i;
  Vec_Int_t *vSupport_local;
  Extra_BitMat_t *pMat_local;
  
  local_2c = 0;
  for (Counter = 0; iVar1 = Vec_IntSize(vSupport), Counter < iVar1; Counter = Counter + 1) {
    iVar1 = Vec_IntEntry(vSupport,Counter);
    local_28 = Counter;
    while( true ) {
      local_28 = local_28 + 1;
      iVar2 = Vec_IntSize(vSupport);
      if (iVar2 <= local_28) break;
      iVar2 = Vec_IntEntry(vSupport,local_28);
      iVar2 = Extra_BitMatrixLookup1(pMat,iVar1,iVar2);
      local_2c = iVar2 + local_2c;
    }
  }
  return local_2c;
}

Assistant:

int Sim_UtilCountPairsOne( Extra_BitMat_t * pMat, Vec_Int_t * vSupport )
{
    int i, k, Index1, Index2;
    int Counter = 0;
//    int Counter2;
    Vec_IntForEachEntry( vSupport, i, Index1 )
    Vec_IntForEachEntryStart( vSupport, k, Index2, Index1+1 )
        Counter += Extra_BitMatrixLookup1( pMat, i, k );
//    Counter2 = Extra_BitMatrixCountOnesUpper(pMat);
//    assert( Counter == Counter2 );
    return Counter;
}